

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O3

void __thiscall
chrono::ChVisualShapeFEA::ChVisualShapeFEA
          (ChVisualShapeFEA *this,shared_ptr<chrono::fea::ChMesh> *fea_mesh)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ChTriangleMeshShape *this_00;
  ChGlyphs *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  ChTriangleMeshShape *size;
  undefined8 uVar4;
  undefined4 uVar7;
  undefined1 auVar6 [32];
  undefined1 auVar8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  undefined1 auVar5 [16];
  
  (this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar7 = 0x3f800000;
  uVar4 = 0x3f8000003f800000;
  auVar5._8_4_ = uVar7;
  auVar5._0_8_ = uVar4;
  auVar5._12_4_ = 0x3f800000;
  (this->meshcolor).R = (float)(int)uVar4;
  (this->meshcolor).G = (float)SUB84(uVar4,4);
  (this->meshcolor).B = (float)uVar7;
  (this->symbolscolor).R = 1.0;
  uVar1 = vmovlps_avx(auVar5);
  (this->symbolscolor).G = (float)(int)uVar1;
  (this->symbolscolor).B = (float)(int)((ulong)uVar1 >> 0x20);
  auVar6 = ZEXT832(0) << 0x20;
  this->m_trimesh_shape = (shared_ptr<chrono::ChTriangleMeshShape>)auVar6._0_16_;
  this->m_glyphs_shape = (shared_ptr<chrono::ChGlyphs>)auVar6._16_16_;
  *(undefined1 (*) [32])
   &(this->m_glyphs_shape).super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount = auVar6;
  __r = &(fea_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
  ;
  (this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fea_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  auVar8._8_4_ = 0x3f000000;
  auVar8._0_8_ = 0x3f0000003f000000;
  auVar8._12_4_ = 0x3f000000;
  this->fem_data_type = SURFACE;
  this->fem_glyph = NONE;
  this->shrink_elements = false;
  this->shrink_factor = 0.9;
  this->colorscale_min = 0.0;
  this->colorscale_max = 1.0;
  this->symbols_scale = 1.0;
  this->symbols_thickness = 0.002;
  this->wireframe = false;
  this->backface_cull = false;
  this->zbuffer_hide = true;
  this->smooth_faces = false;
  this->beam_resolution = 8;
  this->beam_resolution_section = 10;
  this->shell_resolution = 3;
  (this->meshcolor).R = 1.0;
  (this->meshcolor).G = 1.0;
  *(undefined8 *)&(this->meshcolor).B = 0x3f800000;
  uVar1 = vmovlps_avx(auVar8);
  (this->symbolscolor).G = (float)(int)uVar1;
  (this->symbolscolor).B = (float)(int)((ulong)uVar1 >> 0x20);
  this->undeformed_reference = false;
  this_00 = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)__r);
  ChTriangleMeshShape::ChTriangleMeshShape(this_00);
  size = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
            (a_Stack_30,this_00);
  _Var3._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->m_trimesh_shape).
           super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_trimesh_shape).
  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  (this->m_trimesh_shape).
  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  this_01 = (ChGlyphs *)ChVisualShape::operator_new((ChVisualShape *)0xa0,(size_t)size);
  ChGlyphs::ChGlyphs(this_01);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChGlyphs*>
            (a_Stack_30,this_01);
  _Var3._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->m_glyphs_shape).super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_glyphs_shape).super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_01;
  (this->m_glyphs_shape).super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  return;
}

Assistant:

ChVisualShapeFEA::ChVisualShapeFEA(std::shared_ptr<fea::ChMesh> fea_mesh) {
    FEMmesh = fea_mesh;
    fem_data_type = DataType::SURFACE;
    fem_glyph = GlyphType::NONE;

    colorscale_min = 0;
    colorscale_max = 1;

    shrink_elements = false;
    shrink_factor = 0.9;

    symbols_scale = 1.0;
    symbols_thickness = 0.002;

    wireframe = false;
    backface_cull = false;

    zbuffer_hide = true;

    smooth_faces = false;

    beam_resolution = 8;
    beam_resolution_section = 10;
    shell_resolution = 3;

    meshcolor = ChColor(1, 1, 1);
    symbolscolor = ChColor(0, 0.5, 0.5);

    undeformed_reference = false;

    m_trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    m_glyphs_shape = chrono_types::make_shared<ChGlyphs>();
}